

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::readPacket(MatroskaDemuxer *this,AVPacket *avPacket)

{
  int *levelUp;
  int iVar1;
  undefined8 in_RAX;
  _Elt_pointer ppAVar2;
  int64_t *piVar3;
  long lVar4;
  AVPacket *pAVar5;
  AVPacket *pAVar6;
  byte bVar7;
  uint32_t id;
  undefined8 local_38;
  
  bVar7 = 0;
  pAVar6 = this->m_lastDeliveryPacket;
  local_38 = in_RAX;
  if (pAVar6 != (AVPacket *)0x0) {
    if (pAVar6->data != (uint8_t *)0x0) {
      operator_delete__(pAVar6->data);
      pAVar6 = this->m_lastDeliveryPacket;
    }
    operator_delete(pAVar6,0x50);
    this->m_lastDeliveryPacket = (AVPacket *)0x0;
  }
  ppAVar2 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == ppAVar2) {
    levelUp = &this->level_up;
    do {
      if (this->done != false) {
        return 1;
      }
      iVar1 = 0;
      do {
        if (iVar1 != 0) goto LAB_0019ce03;
        iVar1 = ebml_read_element_id(this,(uint32_t *)&local_38,levelUp);
        if (iVar1 < 0) {
          return 1;
        }
        if ((uint32_t)local_38 == 0) {
          return 1;
        }
        if (*levelUp != 0) {
          *levelUp = *levelUp + -1;
          goto LAB_0019ce16;
        }
        if ((uint32_t)local_38 == 0x1a45dfa3) {
          matroska_read_header(this);
          iVar1 = 0;
        }
        else if ((uint32_t)local_38 == 0x1f43b675) {
          iVar1 = ebml_read_master(this,(uint32_t *)((long)&local_38 + 4));
          if (-1 < iVar1) {
            iVar1 = matroska_parse_cluster(this);
            iVar1 = iVar1 + (uint)(iVar1 == 0);
          }
        }
        else {
          iVar1 = ebml_read_skip(this);
        }
      } while (*levelUp == 0);
      *levelUp = *levelUp + -1;
LAB_0019ce03:
      if (iVar1 == -1) {
        this->done = true;
      }
LAB_0019ce16:
      ppAVar2 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur;
    } while ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur == ppAVar2);
  }
  pAVar6 = *ppAVar2;
  std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::pop_front(&(this->packets).c);
  if (pAVar6 == (AVPacket *)0x0) {
    piVar3 = (int64_t *)operator_new(0x50);
    *piVar3 = 0;
    piVar3[1] = 0;
    piVar3[2] = 0;
    piVar3[3] = 0;
    *(undefined4 *)(piVar3 + 4) = 0;
    piVar3[5] = 0;
    piVar3[6] = 0;
    piVar3[7] = 0;
    piVar3[8] = 0;
    *(undefined4 *)(piVar3 + 9) = 0;
    pAVar5 = avPacket;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      pAVar5->pts = *piVar3;
      piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
      pAVar5 = (AVPacket *)((long)pAVar5 + (ulong)bVar7 * -0x10 + 8);
    }
    avPacket->codecID = 0;
  }
  else {
    pAVar5 = pAVar6;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      avPacket->pts = pAVar5->pts;
      pAVar5 = (AVPacket *)((long)pAVar5 + (ulong)bVar7 * -0x10 + 8);
      avPacket = (AVPacket *)((long)avPacket + (ulong)bVar7 * -0x10 + 8);
    }
  }
  this->m_lastDeliveryPacket = pAVar6;
  return 0;
}

Assistant:

int MatroskaDemuxer::readPacket(AVPacket &avPacket)
{
    uint32_t id;
    if (m_lastDeliveryPacket)
    {
        delete[] m_lastDeliveryPacket->data;
        delete m_lastDeliveryPacket;
        m_lastDeliveryPacket = nullptr;
    }

    // Read stream until we have a packet queued.
    AVPacket *newPacket = nullptr;
    while (matroska_deliver_packet(newPacket) != 0)
    {
        // Have we already reached the end?
        if (done)
            return BufferedReader::DATA_EOF;

        int res = 0;
        while (res == 0)
        {
            if ((id = ebml_peek_id(&level_up)) == 0)
            {
                return BufferedReader::DATA_EOF;
            }
            if (level_up)
            {
                level_up--;
                break;
            }

            switch (id)
            {
            case MATROSKA_ID_CLUSTER:
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                if ((res = matroska_parse_cluster()) == 0)
                    res = 1;  // Parsed one cluster, let's get out.
                break;
            case EBML_ID_HEADER:
                matroska_read_header();
                break;
            default:
                res = ebml_read_skip();
            }

            if (level_up)
            {
                level_up--;
                break;
            }
        }

        if (res == -1)
            done = true;
    }
    if (newPacket)
    {
        memcpy(&avPacket, newPacket, sizeof(AVPacket));
    }
    else
        avPacket = *new AVPacket();
    m_lastDeliveryPacket = newPacket;
    return 0;
}